

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_hexenspecialdecs.cpp
# Opt level: O3

int AF_A_LeafSpawn(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  PClass *pPVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  undefined4 extraout_var;
  PClass *pPVar11;
  PClassActor *type;
  AActor *this;
  AActor *pAVar12;
  char *pcVar13;
  bool bVar14;
  DVector2 v;
  DVector3 local_48;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar13 = "(paramnum) < numparam";
    goto LAB_005e2d52;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    pAVar12 = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (pAVar12 == (AActor *)0x0) {
LAB_005e2b09:
        pAVar12 = (AActor *)0x0;
      }
      else {
        pPVar11 = (pAVar12->super_DThinker).super_DObject.Class;
        if (pPVar11 == (PClass *)0x0) {
          iVar4 = (**(pAVar12->super_DThinker).super_DObject._vptr_DObject)(pAVar12);
          pPVar11 = (PClass *)CONCAT44(extraout_var,iVar4);
          (pAVar12->super_DThinker).super_DObject.Class = pPVar11;
        }
        bVar14 = pPVar11 != (PClass *)0x0;
        if (pPVar11 != pPVar3 && bVar14) {
          do {
            pPVar11 = pPVar11->ParentClass;
            bVar14 = pPVar11 != (PClass *)0x0;
            if (pPVar11 == pPVar3) break;
          } while (pPVar11 != (PClass *)0x0);
        }
        if (!bVar14) {
          pcVar13 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005e2d52;
        }
      }
      pPVar3 = AActor::RegistrationInfo.MyClass;
      if (numparam == 1) goto LAB_005e2bc9;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_005e2d42;
        puVar2 = (undefined8 *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (puVar2 != (undefined8 *)0x0) {
            pPVar11 = (PClass *)puVar2[1];
            if (pPVar11 == (PClass *)0x0) {
              pPVar11 = (PClass *)(**(code **)*puVar2)(puVar2);
              puVar2[1] = pPVar11;
            }
            bVar14 = pPVar11 != (PClass *)0x0;
            if (pPVar11 != pPVar3 && bVar14) {
              do {
                pPVar11 = pPVar11->ParentClass;
                bVar14 = pPVar11 != (PClass *)0x0;
                if (pPVar11 == pPVar3) break;
              } while (pPVar11 != (PClass *)0x0);
            }
            if (!bVar14) {
              pcVar13 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_005e2d52;
            }
          }
        }
        else if (puVar2 != (undefined8 *)0x0) goto LAB_005e2d42;
      }
      if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005e2bc9:
        uVar5 = FRandom::GenRand32(&pr_leaf);
        iVar4 = (uVar5 & 3) + 1;
        do {
          uVar5 = FRandom::GenRand32(&pr_leaf);
          uVar6 = FRandom::GenRand32(&pr_leaf);
          uVar7 = FRandom::GenRand32(&pr_leaf);
          uVar8 = FRandom::GenRand32(&pr_leaf);
          uVar9 = FRandom::GenRand32(&pr_leaf);
          uVar10 = FRandom::GenRand32(&pr_leaf);
          pcVar13 = "Leaf1";
          if ((uVar10 & 1) == 0) {
            pcVar13 = "Leaf2";
          }
          type = PClass::FindActor(pcVar13);
          P_GetOffsetPosition((pAVar12->__Pos).X,(pAVar12->__Pos).Y,
                              (double)(int)((uVar5 & 0xff) - (uVar6 & 0xff)) * 0.25,
                              (double)(int)((uVar7 & 0xff) - (uVar8 & 0xff)) * 0.25);
          local_48.Z = (double)(uVar9 & 0xff) * 0.25 + (pAVar12->__Pos).Z;
          this = AActor::StaticSpawn(type,&local_48,ALLOW_REPLACE,false);
          if (this != (AActor *)0x0) {
            uVar5 = FRandom::GenRand32(&pr_leaf);
            AActor::Thrust(this,(double)(uVar5 & 0xff) * 0.0078125 + 3.0);
            (this->target).field_0.p = pAVar12;
            this->special1 = 0;
          }
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
        return 0;
      }
      pcVar13 = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_005e2d52;
    }
    if (pAVar12 == (AActor *)0x0) goto LAB_005e2b09;
  }
LAB_005e2d42:
  pcVar13 = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_005e2d52:
  __assert_fail(pcVar13,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_hexenspecialdecs.cpp"
                ,0xd2,"int AF_A_LeafSpawn(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_LeafSpawn)
{
	PARAM_ACTION_PROLOGUE;

	AActor *mo;
	int i;

	for (i = (pr_leaf()&3)+1; i; i--)
	{
		double xo = pr_leaf.Random2() / 4.;
		double yo = pr_leaf.Random2() / 4.;
		double zo = pr_leaf() / 4.;
		mo = Spawn (pr_leaf()&1 ? PClass::FindActor ("Leaf1") : PClass::FindActor ("Leaf2"),
			self->Vec3Offset(xo, yo, zo), ALLOW_REPLACE);

		if (mo)
		{
			mo->Thrust(pr_leaf() / 128. + 3);
			mo->target = self;
			mo->special1 = 0;
		}
	}
	return 0;
}